

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O2

void __thiscall
QProxyStyle::drawItemText
          (QProxyStyle *this,QPainter *painter,QRect *rect,int flags,QPalette *pal,bool enabled,
          QString *text,ColorRole textRole)

{
  QProxyStylePrivate *this_00;
  QObject *pQVar1;
  undefined7 in_register_00000089;
  
  this_00 = *(QProxyStylePrivate **)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  QProxyStylePrivate::ensureBaseStyle(this_00);
  pQVar1 = (this_00->baseStyle).wp.value;
  (**(code **)(*(long *)pQVar1 + 0x98))
            (pQVar1,painter,rect,flags,pal,CONCAT71(in_register_00000089,enabled) & 0xffffffff);
  return;
}

Assistant:

void QProxyStyle::drawItemText(QPainter *painter, const QRect &rect, int flags, const QPalette &pal, bool enabled,
                               const QString &text, QPalette::ColorRole textRole) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    d->baseStyle->drawItemText(painter, rect, flags, pal, enabled, text, textRole);
}